

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *interfaceNode)

{
  ushort uVar1;
  bool bVar2;
  ListElementCount LVar3;
  bool *__s;
  uint64_t uVar4;
  uint index;
  ulong count;
  StringPtr name;
  Array<bool> sawCodeOrder_heap;
  anon_class_8_1_60e9c21f _kjContextFunc435;
  IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
  local_148;
  Reader methods;
  Reader method;
  Fault f;
  uint local_d0;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:435:7)>
  _kjContext435;
  bool sawCodeOrder_stack [32];
  
  capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&_kjContext435,interfaceNode);
  f.exception = (Exception *)&_kjContext435;
  for (local_d0 = 0; local_d0 != _kjContext435.super_Context.value.ptr._0_4_;
      local_d0 = local_d0 + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator*((Reader *)&methods,
                (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 *)&f);
    if (methods.reader.structDataSize < 0x40) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(uint64_t *)methods.reader.ptr;
    }
    validateTypeId(this,uVar4,INTERFACE);
    capnp::schema::Superclass::Reader::getBrand((Reader *)&method,(Reader *)&methods);
    validate(this,(Reader *)&method);
  }
  capnp::schema::Node::Interface::Reader::getMethods(&methods,interfaceNode);
  count = (ulong)methods.reader.elementCount;
  if (count < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
    __s = sawCodeOrder_stack;
  }
  else {
    __s = kj::_::HeapArrayDisposer::allocate<bool>(count);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.ptr = __s;
    sawCodeOrder_heap.size_ = count;
  }
  memset(__s,0,count);
  LVar3 = methods.reader.elementCount;
  index = 0;
  local_148.container = &methods;
  for (local_148.index = 0; local_148.index != LVar3; local_148.index = local_148.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
    ::operator*(&method,&local_148);
    _kjContextFunc435.method = &method;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:435:7)>
    ::ContextImpl(&_kjContext435,&_kjContextFunc435);
    name.content = (ArrayPtr<const_char>)capnp::schema::Method::Reader::getName(&method);
    validateMemberName(this,name,index);
    if (method._reader.dataSize < 0x10) {
      if ((methods.reader.elementCount != 0) && (*__s == false)) {
        *__s = true;
LAB_0042ad41:
        uVar4 = 0;
        goto LAB_0042ad51;
      }
LAB_0042adda:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x1b8,FAILED,
                 "method.getCodeOrder() < methods.size() && !sawCodeOrder[method.getCodeOrder()]",
                 "\"invalid codeOrder\"",(char (*) [18])"invalid codeOrder");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
      bVar2 = false;
    }
    else {
      uVar1 = *method._reader.data;
      if ((methods.reader.elementCount <= uVar1) || (__s[uVar1] != false)) goto LAB_0042adda;
      __s[uVar1] = true;
      if (method._reader.dataSize < 0x80) goto LAB_0042ad41;
      uVar4 = *(uint64_t *)((long)method._reader.data + 8);
LAB_0042ad51:
      validateTypeId(this,uVar4,STRUCT);
      capnp::schema::Method::Reader::getParamBrand((Reader *)&f,&method);
      validate(this,(Reader *)&f);
      if (method._reader.dataSize < 0xc0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(uint64_t *)((long)method._reader.data + 0x10);
      }
      validateTypeId(this,uVar4,STRUCT);
      capnp::schema::Method::Reader::getResultBrand((Reader *)&f,&method);
      validate(this,(Reader *)&f);
      bVar2 = true;
    }
    kj::_::Debug::Context::~Context(&_kjContext435.super_Context);
    if (!bVar2) break;
    index = index + 1;
  }
  kj::Array<bool>::~Array(&sawCodeOrder_heap);
  return;
}

Assistant:

void validate(const schema::Node::Interface::Reader& interfaceNode) {
    for (auto extend: interfaceNode.getSuperclasses()) {
      validateTypeId(extend.getId(), schema::Node::INTERFACE);
      validate(extend.getBrand());
    }

    auto methods = interfaceNode.getMethods();
    KJ_STACK_ARRAY(bool, sawCodeOrder, methods.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto method: methods) {
      KJ_CONTEXT("validating method", method.getName());
      validateMemberName(method.getName(), index++);

      VALIDATE_SCHEMA(method.getCodeOrder() < methods.size() &&
                      !sawCodeOrder[method.getCodeOrder()],
                      "invalid codeOrder");
      sawCodeOrder[method.getCodeOrder()] = true;

      validateTypeId(method.getParamStructType(), schema::Node::STRUCT);
      validate(method.getParamBrand());
      validateTypeId(method.getResultStructType(), schema::Node::STRUCT);
      validate(method.getResultBrand());
    }
  }